

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void function(ch_compilation *comp)

{
  ch_emit *emit;
  uint8_t last_scope_size;
  byte bVar1;
  ch_emit_scope *blob;
  _Bool _Var2;
  ch_dataptr value;
  ch_scope *pcVar3;
  uint8_t i;
  char cVar4;
  ulong uVar5;
  ch_op op;
  char *local_1a78;
  size_t sStack_1a70;
  ch_token name;
  ch_emit_scope emit_scope;
  ch_scope local_1a20;
  
  memset(&local_1a20,0,0x19e8);
  local_1a20.parent = comp->scope;
  comp->scope = &local_1a20;
  consume(comp,TK_POUND,"Expected start of function.",(ch_token *)0x0);
  _Var2 = consume(comp,TK_ID,"Expected function name.",&name);
  if (_Var2) {
    emit = &comp->emit;
    ch_emit_create_scope(emit,&emit_scope);
    last_scope_size = comp->scope->locals_size;
    cVar4 = '\0';
    consume(comp,TK_POPEN,"Expected (.",(ch_token *)0x0);
    while ((comp->current).kind != TK_PCLOSE) {
      if (cVar4 == '\x02') {
        error(comp,"Exceeded argument limit.");
        cVar4 = -1;
        goto LAB_00103162;
      }
      _Var2 = consume(comp,TK_ID,"Expected variable name.",(ch_token *)&op);
      if (!_Var2) {
        cVar4 = '\0';
        goto LAB_0010317b;
      }
      pcVar3 = comp->scope;
      bVar1 = pcVar3->locals_size;
      pcVar3->locals_size = bVar1 + 1;
      pcVar3->locals[bVar1].name.start = local_1a78;
      pcVar3->locals[bVar1].name.size = sStack_1a70;
      pcVar3->locals[bVar1].is_captured = false;
      if ((comp->current).kind != TK_PCLOSE) {
        consume(comp,TK_COMMA,"Expected comma.",(ch_token *)0x0);
      }
      cVar4 = cVar4 + -1;
    }
    cVar4 = -cVar4;
LAB_00103162:
    consume(comp,TK_PCLOSE,"Expected ).",(ch_token *)0x0);
LAB_0010317b:
    scope(comp);
    end_scope(comp,last_scope_size);
    op = OP_RETURN_VOID;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
    value = ch_emit_commit_scope(emit);
    op = OP_FUNCTION;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
    ch_uint32_to_le_array(value,(uint8_t *)&op);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,4);
    op = CONCAT31(op._1_3_,cVar4);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
    blob = (comp->emit).emit_scope;
    if (blob->parent == (ch_emit_scope *)0x0) {
      pcVar3 = comp->scope;
    }
    else {
      op = OP_CLOSURE;
      ch_emit_write(&blob->bytecode,&op,1);
      op = CONCAT31(op._1_3_,comp->scope->upvalue_count);
      ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
      for (uVar5 = 0; pcVar3 = comp->scope, uVar5 < pcVar3->upvalue_count; uVar5 = uVar5 + 1) {
        op = CONCAT31(op._1_3_,pcVar3->upvalues[uVar5].is_local);
        ch_emit_write(&emit->emit_scope->bytecode,&op,1);
        op = CONCAT31(op._1_3_,pcVar3->upvalues[uVar5].offset);
        ch_emit_write(&emit->emit_scope->bytecode,&op,1);
      }
    }
    comp->scope = pcVar3->parent;
    add_variable(comp,name.lexeme);
  }
  return;
}

Assistant:

void function(ch_compilation *comp) {
  ch_scope locals_scope = new_localscope();
  locals_scope.parent = comp->scope;
  comp->scope = &locals_scope;

  consume(comp, TK_POUND, "Expected start of function.", NULL);
  ch_token name;
  if (!consume(comp, TK_ID, "Expected function name.", &name))
    return;

  ch_emit_scope emit_scope;
  ch_emit_create_scope(&comp->emit, &emit_scope);

  uint8_t scope_mark = begin_scope(comp);
  ch_argcount argcount = function_arglist(comp);
  scope(comp);
  end_scope(comp, scope_mark);

  // Ensure that all functions return
  EMIT_OP(GET_EMIT(comp), OP_RETURN_VOID);

  ch_dataptr function_ptr = ch_emit_commit_scope(&comp->emit);

  EMIT_OP(GET_EMIT(comp), OP_FUNCTION);
  EMIT_PTR(GET_EMIT(comp), function_ptr);
  EMIT_ARGCOUNT(GET_EMIT(comp), argcount);

  if (!CH_EMITTING_GLOBALLY(GET_EMIT(comp))) {
    closure(comp);
  }

  comp->scope = comp->scope->parent;
  add_variable(comp, name.lexeme);
}